

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.c++
# Opt level: O2

ArrayPtr<void_*const>
kj::computeRelativeTrace(ArrayPtr<void_*const> trace,ArrayPtr<void_*const> relativeTo)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  bool bVar15;
  ArrayPtr<void_*const> AVar16;
  
  uVar3 = relativeTo.size_;
  uVar8 = trace.size_;
  uVar6 = uVar8;
  if (3 < uVar3 && 3 < uVar8) {
    lVar9 = 4 - uVar8;
    lVar11 = uVar8 - 4;
    uVar7 = 3;
    while( true ) {
      lVar10 = 0;
      if (0 < lVar11) {
        lVar10 = lVar11;
      }
      lVar4 = 0;
      if (0 < lVar9) {
        lVar4 = lVar9;
      }
      uVar14 = uVar3 - lVar4;
      if (uVar8 - lVar10 < uVar3 - lVar4) {
        uVar14 = uVar8 - lVar10;
      }
      if ((long)(uVar3 - 4) < lVar9) break;
      lVar5 = -lVar9;
      if (lVar5 == 0 || 0 < lVar9) {
        lVar5 = 0;
      }
      uVar13 = uVar8 - lVar5;
      lVar5 = 0;
      if (0 < lVar9) {
        lVar5 = lVar9;
      }
      uVar12 = uVar3 - lVar5;
      if (uVar13 <= uVar3 - lVar5) {
        uVar12 = uVar13;
      }
      uVar2 = (uint)uVar12;
      lVar5 = -8;
      for (uVar12 = 0; uVar14 != uVar12; uVar12 = uVar12 + 1) {
        if (*(long *)((long)trace.ptr + lVar5 + lVar10 * -8 + uVar8 * 8) !=
            *(long *)((long)relativeTo.ptr + lVar5 + lVar4 * -8 + uVar3 * 8)) {
          uVar2 = (uint)uVar12;
          break;
        }
        lVar5 = lVar5 + -8;
      }
      bVar15 = uVar7 < uVar2;
      uVar1 = uVar2;
      if (!bVar15 && uVar7 != uVar2) {
        uVar1 = uVar7;
      }
      uVar7 = uVar1;
      if (bVar15) {
        uVar6 = (uVar13 - uVar2) + 1;
      }
      lVar9 = lVar9 + 1;
      lVar11 = lVar11 + -1;
    }
  }
  AVar16.size_ = uVar6;
  AVar16.ptr = trace.ptr;
  return AVar16;
}

Assistant:

kj::ArrayPtr<void* const> computeRelativeTrace(
    kj::ArrayPtr<void* const> trace, kj::ArrayPtr<void* const> relativeTo) {
  using miniposix::ssize_t;

  static constexpr size_t MIN_MATCH_LEN = 4;
  if (trace.size() < MIN_MATCH_LEN || relativeTo.size() < MIN_MATCH_LEN) {
    return trace;
  }

  kj::ArrayPtr<void* const> bestMatch = trace;
  uint bestMatchLen = MIN_MATCH_LEN - 1;  // must beat this to choose something else

  // `trace` and `relativeTrace` may have been truncated at different points. We iterate through
  // truncating various suffixes from one of the two and then seeing if the remaining suffixes
  // match.
  for (ssize_t i = -(ssize_t)(trace.size() - MIN_MATCH_LEN);
       i <= (ssize_t)(relativeTo.size() - MIN_MATCH_LEN);
       i++) {
    // Negative values truncate `trace`, positive values truncate `relativeTo`.
    kj::ArrayPtr<void* const> subtrace = trace.first(trace.size() - kj::max<ssize_t>(0, -i));
    kj::ArrayPtr<void* const> subrt = relativeTo
        .first(relativeTo.size() - kj::max<ssize_t>(0, i));

    uint matchLen = sharedSuffixLength(subtrace, subrt);
    if (matchLen > bestMatchLen) {
      bestMatchLen = matchLen;
      bestMatch = subtrace.first(subtrace.size() - matchLen + 1);
    }
  }

  return bestMatch;
}